

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateArray(ExpressionEvalContext *ctx,ExprArray *expression)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  bool bVar4;
  int iVar5;
  StackFrame **ppSVar6;
  undefined4 extraout_var;
  ExprPointerLiteral *target;
  ExprBase *value;
  undefined4 extraout_var_00;
  TypeRef *type;
  ExprBase *pEVar7;
  uint uVar8;
  uchar *ptr;
  IntrusiveList<ExprBase> *pIVar9;
  
  if (((ctx->stackFrames).count != 0) &&
     (ppSVar6 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar6)->targetYield != 0)) {
    pAVar1 = ctx->ctx->allocator;
    iVar5 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar5);
    pSVar2 = (expression->super_ExprBase).source;
    pTVar3 = ctx->ctx->typeVoid;
    pEVar7->typeID = 2;
    pEVar7->source = pSVar2;
    pEVar7->type = pTVar3;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240668;
    return pEVar7;
  }
  bVar4 = AddInstruction(ctx);
  if ((bVar4) &&
     (target = AllocateTypeStorage(ctx,(expression->super_ExprBase).source,
                                   (expression->super_ExprBase).type),
     target != (ExprPointerLiteral *)0x0)) {
    pTVar3 = (expression->super_ExprBase).type;
    if ((pTVar3 == (TypeBase *)0x0) || (pTVar3->typeID != 0x13)) {
      __assert_fail("arrayType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x3d5,"ExprBase *EvaluateArray(ExpressionEvalContext &, ExprArray *)");
    }
    uVar8 = 0;
    pIVar9 = &expression->values;
    while (pEVar7 = pIVar9->head, pEVar7 != (ExprBase *)0x0) {
      value = Evaluate(ctx,pEVar7);
      if (value == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
      ptr = target->ptr + uVar8;
      if (target->end < ptr + (long)pTVar3[1]._vptr_TypeBase[6]) {
        __assert_fail("storage->ptr + offset + arrayType->subType->size <= storage->end",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x3e0,"ExprBase *EvaluateArray(ExpressionEvalContext &, ExprArray *)");
      }
      pAVar1 = ctx->ctx->allocator;
      iVar5 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x40);
      pSVar2 = (expression->super_ExprBase).source;
      type = ExpressionContext::GetReferenceType(ctx->ctx,(TypeBase *)pTVar3[1]._vptr_TypeBase);
      ExprPointerLiteral::ExprPointerLiteral
                ((ExprPointerLiteral *)CONCAT44(extraout_var_00,iVar5),pSVar2,&type->super_TypeBase,
                 ptr,ptr + (long)pTVar3[1]._vptr_TypeBase[6]);
      bVar4 = CreateStore(ctx,(ExprBase *)CONCAT44(extraout_var_00,iVar5),value);
      if (!bVar4) {
        return (ExprBase *)0x0;
      }
      uVar8 = uVar8 + *(int *)(pTVar3[1]._vptr_TypeBase + 6);
      pIVar9 = (IntrusiveList<ExprBase> *)&pEVar7->next;
    }
    pEVar7 = CreateLoad(ctx,&target->super_ExprBase);
    if (pEVar7 != (ExprBase *)0x0) {
      pEVar7 = CheckType(&expression->super_ExprBase,pEVar7);
      return pEVar7;
    }
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateArray(ExpressionEvalContext &ctx, ExprArray *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprPointerLiteral *storage = AllocateTypeStorage(ctx, expression->source, expression->type);

	if(!storage)
		return NULL;

	TypeArray *arrayType = getType<TypeArray>(expression->type);

	assert(arrayType);

	unsigned offset = 0;

	for(ExprBase *value = expression->values.head; value; value = value->next)
	{
		ExprBase *element = Evaluate(ctx, value);

		if(!element)
			return NULL;

		assert(storage->ptr + offset + arrayType->subType->size <= storage->end);

		unsigned char *targetPtr = storage->ptr + offset;

		ExprPointerLiteral *target = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(arrayType->subType), targetPtr, targetPtr + arrayType->subType->size);

		if(!CreateStore(ctx, target, element))
			return NULL;

		offset += unsigned(arrayType->subType->size);
	}

	ExprBase *load = CreateLoad(ctx, storage);

	if(!load)
		return NULL;

	return CheckType(expression, load);
}